

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtApi::convertBuffer(RtApi *this,char *outBuffer,char *inBuffer,ConvertInfo *info)

{
  char cVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  RtAudioFormat RVar6;
  pointer piVar7;
  pointer piVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  Float64 *in;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  
  if ((((this->stream_).deviceBuffer == outBuffer) && ((this->stream_).mode == DUPLEX)) &&
     (iVar3 = info->outJump, info->inJump < iVar3)) {
    uVar16 = (this->stream_).bufferSize;
    uVar10 = formatBytes(this,info->outFormat);
    memset(outBuffer,0,(ulong)(iVar3 * uVar16 * uVar10));
  }
  RVar6 = info->outFormat;
  switch(RVar6) {
  case 1:
    if ((info->inFormat == 1) && ((this->stream_).bufferSize != 0)) {
      uVar16 = 0;
      pcVar12 = inBuffer;
      do {
        if (0 < info->channels) {
          lVar17 = 0;
          do {
            outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17]] =
                 pcVar12[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar17]];
            lVar17 = lVar17 + 1;
          } while (lVar17 < info->channels);
        }
        pcVar12 = pcVar12 + info->inJump;
        outBuffer = outBuffer + info->outJump;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (this->stream_).bufferSize);
    }
    RVar6 = info->inFormat;
    if ((long)RVar6 < 8) {
      if (RVar6 == 2) {
        if ((this->stream_).bufferSize != 0) {
          uVar16 = 0;
          do {
            if (0 < info->channels) {
              lVar17 = 0;
              do {
                outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar17]] =
                     inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar17] * 2 + 1];
                lVar17 = lVar17 + 1;
              } while (lVar17 < info->channels);
            }
            inBuffer = inBuffer + (long)info->inJump * 2;
            outBuffer = outBuffer + info->outJump;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->stream_).bufferSize);
        }
      }
      else if ((RVar6 == 4) && ((this->stream_).bufferSize != 0)) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17]] =
                   inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] * 4 + 2];
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    else if (RVar6 == 8) {
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17]] =
                   inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17] * 4 + 3];
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    else if (RVar6 == 0x10) {
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              lVar11 = llroundf(*(float *)(inBuffer +
                                          (long)(info->inOffset).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[lVar17] * 4
                                          ) * 128.0);
              if (0x7e < lVar11) {
                lVar11 = 0x7f;
              }
              if (lVar11 < -0x7f) {
                lVar11 = -0x80;
              }
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17]] = (char)lVar11;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    else if ((RVar6 == 0x20) && ((this->stream_).bufferSize != 0)) {
      uVar16 = 0;
      do {
        if (0 < info->channels) {
          lVar17 = 0;
          do {
            lVar11 = llround(*(double *)
                              (inBuffer +
                              (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar17] * 8) * 128.0);
            if (0x7e < lVar11) {
              lVar11 = 0x7f;
            }
            if (lVar11 < -0x7f) {
              lVar11 = -0x80;
            }
            outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17]] = (char)lVar11;
            lVar17 = lVar17 + 1;
          } while (lVar17 < info->channels);
        }
        inBuffer = inBuffer + (long)info->inJump * 8;
        outBuffer = outBuffer + info->outJump;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (this->stream_).bufferSize);
    }
    break;
  case 2:
    RVar6 = info->inFormat;
    switch(RVar6) {
    case 1:
      uVar16 = (this->stream_).bufferSize;
      if (uVar16 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = info->inJump;
        iVar4 = info->outJump;
        uVar14 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              *(ushort *)(outBuffer + (long)piVar8[uVar15] * 2) =
                   (ushort)(byte)inBuffer[piVar7[uVar15]] << 8;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          inBuffer = inBuffer + iVar3;
          outBuffer = outBuffer + (long)iVar4 * 2;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar16);
      }
      break;
    case 2:
      uVar16 = (this->stream_).bufferSize;
      if (uVar16 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = info->inJump;
        iVar4 = info->outJump;
        uVar14 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              *(undefined2 *)(outBuffer + (long)piVar8[uVar15] * 2) =
                   *(undefined2 *)(inBuffer + (long)piVar7[uVar15] * 2);
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          inBuffer = inBuffer + (long)iVar3 * 2;
          outBuffer = outBuffer + (long)iVar4 * 2;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar16);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar16 = (this->stream_).bufferSize;
      if (uVar16 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = info->inJump;
        iVar4 = info->outJump;
        uVar14 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              *(undefined2 *)(outBuffer + (long)piVar8[uVar15] * 2) =
                   *(undefined2 *)(inBuffer + (long)piVar7[uVar15] * 4 + 1);
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          inBuffer = inBuffer + (long)iVar3 * 4;
          outBuffer = outBuffer + (long)iVar4 * 2;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar16);
      }
      break;
    case 8:
      uVar16 = (this->stream_).bufferSize;
      if (uVar16 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = info->inJump;
        iVar4 = info->outJump;
        uVar14 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              *(undefined2 *)(outBuffer + (long)piVar8[uVar15] * 2) =
                   *(undefined2 *)(inBuffer + (long)piVar7[uVar15] * 4 + 2);
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          inBuffer = inBuffer + (long)iVar3 * 4;
          outBuffer = outBuffer + (long)iVar4 * 2;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar16);
      }
      break;
    default:
      if (RVar6 == 0x10) {
        if ((this->stream_).bufferSize != 0) {
          uVar16 = 0;
          do {
            if (0 < info->channels) {
              lVar17 = 0;
              do {
                lVar11 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar17] *
                                            4) * 32768.0);
                if (0x7ffe < lVar11) {
                  lVar11 = 0x7fff;
                }
                if (lVar11 < -0x7fff) {
                  lVar11 = -0x8000;
                }
                *(short *)(outBuffer +
                          (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar17] * 2) =
                     (short)lVar11;
                lVar17 = lVar17 + 1;
              } while (lVar17 < info->channels);
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 2;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->stream_).bufferSize);
        }
      }
      else if ((RVar6 == 0x20) && ((this->stream_).bufferSize != 0)) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              lVar11 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar17] * 8) *
                               32768.0);
              if (0x7ffe < lVar11) {
                lVar11 = 0x7fff;
              }
              if (lVar11 < -0x7fff) {
                lVar11 = -0x8000;
              }
              *(short *)(outBuffer +
                        (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar17] * 2) = (short)lVar11;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 2;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    RVar6 = info->inFormat;
    switch(RVar6) {
    case 1:
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              cVar1 = inBuffer[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar17]];
              lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar17];
              (outBuffer + lVar11 * 4)[0] = '\0';
              (outBuffer + lVar11 * 4)[1] = '\0';
              outBuffer[lVar11 * 4 + 2] = cVar1;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + info->inJump;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 2:
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              uVar2 = *(undefined2 *)
                       (inBuffer +
                       (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar17] * 2);
              lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar17];
              outBuffer[lVar11 * 4] = '\0';
              outBuffer[lVar11 * 4 + 1] = (char)uVar2;
              outBuffer[lVar11 * 4 + 2] = (char)((ushort)uVar2 >> 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 2;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              *(undefined4 *)
               (outBuffer +
               (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17] * 4) =
                   *(undefined4 *)
                    (inBuffer +
                    (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar17] * 4);
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 8:
      if ((this->stream_).bufferSize != 0) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              uVar5 = *(undefined4 *)
                       (inBuffer +
                       (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar17] * 4);
              lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar17];
              outBuffer[lVar11 * 4] = (char)((uint)uVar5 >> 8);
              outBuffer[lVar11 * 4 + 1] = (char)((uint)uVar5 >> 0x10);
              outBuffer[lVar11 * 4 + 2] = (char)((uint)uVar5 >> 0x18);
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    default:
      if (RVar6 == 0x10) {
        if ((this->stream_).bufferSize != 0) {
          uVar16 = 0;
          do {
            if (0 < info->channels) {
              lVar17 = 0;
              do {
                lVar11 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar17] *
                                            4) * 8388608.0);
                if (0x7ffffe < lVar11) {
                  lVar11 = 0x7fffff;
                }
                if (lVar11 < -0x7fffff) {
                  lVar11 = -0x800000;
                }
                lVar13 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar17];
                outBuffer[lVar13 * 4] = (char)lVar11;
                outBuffer[lVar13 * 4 + 1] = (char)((ulong)lVar11 >> 8);
                outBuffer[lVar13 * 4 + 2] = (char)((ulong)lVar11 >> 0x10);
                lVar17 = lVar17 + 1;
              } while (lVar17 < info->channels);
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->stream_).bufferSize);
        }
      }
      else if ((RVar6 == 0x20) && ((this->stream_).bufferSize != 0)) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              lVar11 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar17] * 8) *
                               8388608.0);
              if (0x7ffffe < lVar11) {
                lVar11 = 0x7fffff;
              }
              if (lVar11 < -0x7fffff) {
                lVar11 = -0x800000;
              }
              lVar13 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar17];
              outBuffer[lVar13 * 4] = (char)lVar11;
              outBuffer[lVar13 * 4 + 1] = (char)((ulong)lVar11 >> 8);
              outBuffer[lVar13 * 4 + 2] = (char)((ulong)lVar11 >> 0x10);
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    break;
  case 8:
    RVar6 = info->inFormat;
    switch(RVar6) {
    case 1:
      if ((this->stream_).bufferSize != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              *(int *)(outBuffer + (long)piVar8[lVar17] * 4) = (int)inBuffer[piVar7[lVar17]];
              *(int *)(outBuffer + (long)piVar8[lVar17] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar17] * 4) << 0x18;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + info->inJump;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 2:
      if ((this->stream_).bufferSize != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              *(int *)(outBuffer + (long)piVar8[lVar17] * 4) =
                   (int)*(short *)(inBuffer + (long)piVar7[lVar17] * 2);
              *(int *)(outBuffer + (long)piVar8[lVar17] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar17] * 4) << 0x10;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 2;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      if ((this->stream_).bufferSize != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              lVar11 = (long)piVar7[lVar17];
              cVar1 = inBuffer[lVar11 * 4 + 2];
              uVar10 = CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar11 * 4)) - 0x1000000;
              if (-1 < cVar1) {
                uVar10 = (uint)CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar11 * 4));
              }
              *(uint *)(outBuffer + (long)piVar8[lVar17] * 4) = uVar10;
              *(int *)(outBuffer + (long)piVar8[lVar17] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar17] * 4) << 8;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    case 8:
      if ((this->stream_).bufferSize != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              *(undefined4 *)(outBuffer + (long)piVar8[lVar17] * 4) =
                   *(undefined4 *)(inBuffer + (long)piVar7[lVar17] * 4);
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
      break;
    default:
      if (RVar6 == 0x10) {
        if ((this->stream_).bufferSize != 0) {
          uVar16 = 0;
          do {
            if (0 < info->channels) {
              lVar17 = 0;
              do {
                lVar11 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar17] *
                                            4) * 2.1474836e+09);
                if (0x7ffffffe < lVar11) {
                  lVar11 = 0x7fffffff;
                }
                if (lVar11 < -0x7fffffff) {
                  lVar11 = -0x80000000;
                }
                *(int *)(outBuffer +
                        (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar17] * 4) = (int)lVar11;
                lVar17 = lVar17 + 1;
              } while (lVar17 < info->channels);
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->stream_).bufferSize);
        }
      }
      else if ((RVar6 == 0x20) && ((this->stream_).bufferSize != 0)) {
        uVar16 = 0;
        do {
          if (0 < info->channels) {
            lVar17 = 0;
            do {
              lVar11 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar17] * 8) *
                               2147483648.0);
              if (0x7ffffffe < lVar11) {
                lVar11 = 0x7fffffff;
              }
              if (lVar11 < -0x7fffffff) {
                lVar11 = -0x80000000;
              }
              *(int *)(outBuffer +
                      (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar17] * 4) = (int)lVar11;
              lVar17 = lVar17 + 1;
            } while (lVar17 < info->channels);
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->stream_).bufferSize);
      }
    }
    break;
  default:
    if (RVar6 == 0x10) {
      RVar6 = info->inFormat;
      switch(RVar6) {
      case 1:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar15] * 4) =
                     (float)(int)inBuffer[piVar7[uVar15]] * 0.0078125;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + iVar3;
            outBuffer = outBuffer + (long)iVar4 * 4;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 2:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar15] * 4) =
                     (float)(int)*(short *)(inBuffer + (long)piVar7[uVar15] * 2) * 3.0517578e-05;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 2;
            outBuffer = outBuffer + (long)iVar4 * 4;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                lVar17 = (long)piVar7[uVar15];
                cVar1 = inBuffer[lVar17 * 4 + 2];
                uVar9 = CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar17 * 4)) - 0x1000000;
                if (-1 < cVar1) {
                  uVar9 = (uint)CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar17 * 4));
                }
                *(float *)(outBuffer + (long)piVar8[uVar15] * 4) = (float)(int)uVar9 * 1.1920929e-07
                ;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 4;
            outBuffer = outBuffer + (long)iVar4 * 4;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 8:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar15] * 4) =
                     (float)*(int *)(inBuffer + (long)piVar7[uVar15] * 4) * 4.656613e-10;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 4;
            outBuffer = outBuffer + (long)iVar4 * 4;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      default:
        if (RVar6 == 0x10) {
          uVar16 = (this->stream_).bufferSize;
          if (uVar16 != 0) {
            uVar10 = info->channels;
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = info->inJump;
            iVar4 = info->outJump;
            uVar14 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar15 = 0;
                do {
                  *(undefined4 *)(outBuffer + (long)piVar8[uVar15] * 4) =
                       *(undefined4 *)(inBuffer + (long)piVar7[uVar15] * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              inBuffer = inBuffer + (long)iVar3 * 4;
              outBuffer = outBuffer + (long)iVar4 * 4;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar16);
          }
        }
        else if ((RVar6 == 0x20) && (uVar16 = (this->stream_).bufferSize, uVar16 != 0)) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar15] * 4) =
                     (float)*(double *)(inBuffer + (long)piVar7[uVar15] * 8);
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 8;
            outBuffer = outBuffer + (long)iVar4 * 4;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
      }
    }
    else if (RVar6 == 0x20) {
      RVar6 = info->inFormat;
      switch(RVar6) {
      case 1:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar15] * 8) =
                     (double)(int)inBuffer[piVar7[uVar15]] * 0.0078125;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + iVar3;
            outBuffer = outBuffer + (long)iVar4 * 8;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 2:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar15] * 8) =
                     (double)(int)*(short *)(inBuffer + (long)piVar7[uVar15] * 2) * 3.0517578125e-05
                ;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 2;
            outBuffer = outBuffer + (long)iVar4 * 8;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                lVar17 = (long)piVar7[uVar15];
                cVar1 = inBuffer[lVar17 * 4 + 2];
                uVar9 = CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar17 * 4)) - 0x1000000;
                if (-1 < cVar1) {
                  uVar9 = (uint)CONCAT12(cVar1,*(undefined2 *)(inBuffer + lVar17 * 4));
                }
                *(double *)(outBuffer + (long)piVar8[uVar15] * 8) =
                     (double)(int)uVar9 * 1.1920928955078125e-07;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 4;
            outBuffer = outBuffer + (long)iVar4 * 8;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      case 8:
        uVar16 = (this->stream_).bufferSize;
        if (uVar16 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar15] * 8) =
                     (double)*(int *)(inBuffer + (long)piVar7[uVar15] * 4) * 4.656612873077393e-10;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 4;
            outBuffer = outBuffer + (long)iVar4 * 8;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
        break;
      default:
        if (RVar6 == 0x10) {
          uVar16 = (this->stream_).bufferSize;
          if (uVar16 != 0) {
            uVar10 = info->channels;
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = info->inJump;
            iVar4 = info->outJump;
            uVar14 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar15 = 0;
                do {
                  *(double *)(outBuffer + (long)piVar8[uVar15] * 8) =
                       (double)*(float *)(inBuffer + (long)piVar7[uVar15] * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              inBuffer = inBuffer + (long)iVar3 * 4;
              outBuffer = outBuffer + (long)iVar4 * 8;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar16);
          }
        }
        else if ((RVar6 == 0x20) && (uVar16 = (this->stream_).bufferSize, uVar16 != 0)) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = info->inJump;
          iVar4 = info->outJump;
          uVar14 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar15 = 0;
              do {
                *(undefined8 *)(outBuffer + (long)piVar8[uVar15] * 8) =
                     *(undefined8 *)(inBuffer + (long)piVar7[uVar15] * 8);
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            inBuffer = inBuffer + (long)iVar3 * 8;
            outBuffer = outBuffer + (long)iVar4 * 8;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
        }
      }
    }
  }
  return;
}

Assistant:

void RtApi :: convertBuffer( char *outBuffer, char *inBuffer, ConvertInfo &info )
{
  // This function does format conversion, input/output channel compensation, and
  // data interleaving/deinterleaving.  24-bit integers are assumed to occupy
  // the lower three bytes of a 32-bit integer.

  // Clear our duplex device output buffer if there are more device outputs than user outputs
  if ( outBuffer == stream_.deviceBuffer && stream_.mode == DUPLEX && info.outJump > info.inJump )
    memset( outBuffer, 0, stream_.bufferSize * info.outJump * formatBytes( info.outFormat ) );

  int j;
  if (info.outFormat == RTAUDIO_FLOAT64) {
    Float64 *out = (Float64 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 128.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 32768.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]].asInt() / 8388608.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 2147483648.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      // Channel compensation and/or (de)interleaving only.
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_FLOAT32) {
    Float32 *out = (Float32 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 128.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 32768.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]].asInt() / 8388608.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 2147483648.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      // Channel compensation and/or (de)interleaving only.
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT32) {
    Int32 *out = (Int32 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 24;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]].asInt();
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      // Channel compensation and/or (de)interleaving only.
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          // Use llround() which returns `long long` which is guaranteed to be at least 64 bits.
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.f), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.0), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT24) {
    Int24 *out = (Int24 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 16);
          //out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 8);
          //out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      // Channel compensation and/or (de)interleaving only.
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] >> 8);
          //out[info.outOffset[j]] >>= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.f), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.0), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT16) {
    Int16 *out = (Int16 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      // Channel compensation and/or (de)interleaving only.
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) (in[info.inOffset[j]].asInt() >> 8);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) ((in[info.inOffset[j]] >> 16) & 0x0000ffff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.f), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.0), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT8) {
    signed char *out = (signed char *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      // Channel compensation and/or (de)interleaving only.
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 8) & 0x00ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) (in[info.inOffset[j]].asInt() >> 16);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 24) & 0x000000ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.f), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.0), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
}